

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

exr_result_t
LossyDctEncoder_base_construct
          (LossyDctEncoder *e,float quantBaseError,uint8_t *packedAc,uint8_t *packedDc,
          uint16_t *toNonlinear,int width,int height)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  float *in_RDI;
  float in_R8D;
  float in_R9D;
  float in_XMM0_Da;
  int idx;
  int jpegQuantTableCbCrMin;
  int jpegQuantTableCbCr [64];
  int jpegQuantTableYMin;
  int jpegQuantTableY [64];
  int local_250;
  int local_248 [67];
  int local_13c;
  int local_138 [76];
  float *local_8;
  
  *in_RDI = in_XMM0_Da;
  in_RDI[1] = in_R8D;
  in_RDI[2] = in_R9D;
  *(undefined8 *)(in_RDI + 4) = in_RCX;
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  *(undefined8 *)(in_RDI + 0x10) = in_RSI;
  *(undefined8 *)(in_RDI + 0x12) = in_RDX;
  local_8 = in_RDI;
  memcpy(local_138,&DAT_003382d0,0x100);
  local_13c = 10;
  memcpy(local_248,&DAT_003383d0,0x100);
  if (*local_8 <= 0.0 && *local_8 != 0.0) {
    *local_8 = 0.0;
  }
  for (local_250 = 0; local_250 < 0x40; local_250 = local_250 + 1) {
    local_8[(long)local_250 + 0x14] = (*local_8 * (float)local_138[local_250]) / (float)local_13c;
    local_8[(long)local_250 + 0x54] = (*local_8 * (float)local_248[local_250]) / 17.0;
  }
  local_8[8] = 0.0;
  local_8[9] = 0.0;
  local_8[10] = 0.0;
  local_8[0xb] = 0.0;
  local_8[0xc] = 0.0;
  local_8[0xd] = 0.0;
  local_8[0xe] = 0.0;
  return 0;
}

Assistant:

exr_result_t
LossyDctEncoder_base_construct (
    LossyDctEncoder* e,
    float            quantBaseError,
    uint8_t*         packedAc,
    uint8_t*         packedDc,
    const uint16_t*  toNonlinear,
    int              width,
    int              height)
{
    e->_quantBaseError = quantBaseError;
    e->_width          = width;
    e->_height         = height;
    e->_toNonlinear    = toNonlinear;
    e->_numAcComp      = 0;
    e->_numDcComp      = 0;
    e->_packedAc       = packedAc;
    e->_packedDc       = packedDc;
    //
    // Here, we take the generic JPEG quantization tables and
    // normalize them by the smallest component in each table.
    // This gives us a relationship amongst the DCT components,
    // in terms of how sensitive each component is to
    // error.
    //
    // A higher normalized value means we can quantize more,
    // and a small normalized value means we can quantize less.
    //
    // Eventually, we will want an acceptable quantization
    // error range for each component. We find this by
    // multiplying some user-specified level (_quantBaseError)
    // by the normalized table (_quantTableY, _quantTableCbCr) to
    // find the acceptable quantization error range.
    //
    // The quantization table is not needed for decoding, and
    // is not transmitted. So, if you want to get really fancy,
    // you could derive some content-dependent quantization
    // table, and the decoder would not need to be changed. But,
    // for now, we'll just use statice quantization tables.
    //

    int jpegQuantTableY[] = {
        16, 11, 10, 16, 24,  40,  51,  61,  12, 12, 14, 19, 26,  58,  60,  55,
        14, 13, 16, 24, 40,  57,  69,  56,  14, 17, 22, 29, 51,  87,  80,  62,
        18, 22, 37, 56, 68,  109, 103, 77,  24, 35, 55, 64, 81,  104, 113, 92,
        49, 64, 78, 87, 103, 121, 120, 101, 72, 92, 95, 98, 112, 100, 103, 99};

    int jpegQuantTableYMin = 10;

    int jpegQuantTableCbCr[] = {
        17, 18, 24, 47, 99, 99, 99, 99, 18, 21, 26, 66, 99, 99, 99, 99,
        24, 26, 56, 99, 99, 99, 99, 99, 47, 66, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99};

    int jpegQuantTableCbCrMin = 17;

    if (e->_quantBaseError < 0) e->_quantBaseError = 0;

    for (int idx = 0; idx < 64; ++idx)
    {
        e->_quantTableY[idx] =
            (e->_quantBaseError * (float) (jpegQuantTableY[idx]) /
             (float) (jpegQuantTableYMin));

        e->_quantTableCbCr[idx] =
            (e->_quantBaseError * (float) (jpegQuantTableCbCr[idx]) /
             (float) (jpegQuantTableCbCrMin));
    }

    e->_channel_encode_data[0]    = NULL;
    e->_channel_encode_data[1]    = NULL;
    e->_channel_encode_data[2]    = NULL;
    e->_channel_encode_data_count = 0;

    return EXR_ERR_SUCCESS;
}